

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall
olc::PixelGameEngine::DrawStringPropDecal
          (PixelGameEngine *this,vf2d *pos,string *sText,Pixel col,vf2d *scale)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  pointer pvVar4;
  short sVar5;
  size_type sVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  anon_union_4_2_12391da5_for_Pixel_0 local_54;
  vf2d local_50;
  vf2d local_48;
  vf2d local_40;
  vf2d *local_38;
  
  pcVar2 = (sText->_M_dataplus)._M_p;
  sVar3 = sText->_M_string_length;
  fVar8 = 0.0;
  fVar9 = 0.0;
  local_54 = col.field_0;
  local_38 = pos;
  for (sVar6 = 0; sVar3 != sVar6; sVar6 = sVar6 + 1) {
    cVar1 = pcVar2[sVar6];
    lVar7 = (long)cVar1;
    if (lVar7 == 10) {
      fVar9 = fVar9 + scale->y * 8.0;
      fVar8 = 0.0;
    }
    else {
      sVar5 = cVar1 + -0x20;
      local_40.x = local_38->x + fVar8;
      local_40.y = local_38->y + fVar9;
      pvVar4 = (this->vFontSpacing).
               super__Vector_base<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_48.x = (float)(int)(sVar5 % 0x10) * 8.0 + (float)pvVar4[lVar7 + -0x20].x;
      local_48.y = (float)(int)(sVar5 / 0x10) * 8.0;
      local_50.x = (float)pvVar4[lVar7 + -0x20].y;
      local_50.y = 8.0;
      DrawPartialDecal(this,&local_40,this->fontDecal,&local_48,&local_50,scale,
                       (Pixel *)&local_54.field_1);
      fVar8 = fVar8 + (float)(this->vFontSpacing).
                             super__Vector_base<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar7 + -0x20].y * scale->x;
    }
  }
  return;
}

Assistant:

void PixelGameEngine::DrawStringPropDecal(const olc::vf2d& pos, const std::string& sText, const Pixel col, const olc::vf2d& scale)
	{
		olc::vf2d spos = { 0.0f, 0.0f };
		for (auto c : sText)
		{
			if (c == '\n')
			{
				spos.x = 0; spos.y += 8.0f * scale.y;
			}
			else
			{
				int32_t ox = (c - 32) % 16;
				int32_t oy = (c - 32) / 16;
				DrawPartialDecal(pos + spos, fontDecal, { float(ox) * 8.0f + float(vFontSpacing[c - 32].x), float(oy) * 8.0f }, { float(vFontSpacing[c - 32].y), 8.0f }, scale, col);
				spos.x += float(vFontSpacing[c - 32].y) * scale.x;
			}
		}
	}